

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

void ELFIO::dump::dynamic_tags(ostream *out,elfio *reader)

{
  undefined8 value_00;
  Elf_Xword tag_00;
  Elf_Xword no;
  bool bVar1;
  byte bVar2;
  int iVar3;
  pointer psVar4;
  ostream *poVar5;
  undefined1 local_c0 [8];
  string str;
  Elf_Xword value;
  Elf_Xword tag;
  Elf_Xword i;
  string local_78 [32];
  Elf_Xword local_58;
  Elf_Xword dyn_no;
  dynamic_section_accessor dynamic;
  unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *sec;
  const_iterator __end2;
  const_iterator __begin2;
  Sections *__range2;
  elfio *reader_local;
  ostream *out_local;
  
  __end2 = elfio::Sections::begin(&reader->sections);
  sec = (unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
        elfio::Sections::end(&reader->sections);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
                                *)&sec);
    if (!bVar1) {
      return;
    }
    dynamic.entries_num =
         (Elf_Xword)
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
         ::operator*(&__end2);
    psVar4 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::operator->
                       ((unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
                        dynamic.entries_num);
    iVar3 = (*psVar4->_vptr_section[5])();
    if (iVar3 == 6) {
      psVar4 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::get
                         ((unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
                          dynamic.entries_num);
      dynamic_section_accessor_template<ELFIO::section>::dynamic_section_accessor_template
                ((dynamic_section_accessor_template<ELFIO::section> *)&dyn_no,reader,psVar4);
      local_58 = dynamic_section_accessor_template<ELFIO::section>::get_entries_num
                           ((dynamic_section_accessor_template<ELFIO::section> *)&dyn_no);
      if (local_58 != 0) {
        poVar5 = std::operator<<(out,"Dynamic section (");
        psVar4 = std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::operator->
                           ((unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *)
                            dynamic.entries_num);
        (*psVar4->_vptr_section[3])();
        poVar5 = std::operator<<(poVar5,local_78);
        poVar5 = std::operator<<(poVar5,")");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_78);
        poVar5 = std::operator<<(out,"[  Nr ] Tag              Name/Value");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        for (tag = 0; tag < local_58; tag = tag + 1) {
          value = 0;
          str.field_2._8_8_ = 0;
          std::__cxx11::string::string((string *)local_c0);
          dynamic_section_accessor_template<ELFIO::section>::get_entry
                    ((dynamic_section_accessor_template<ELFIO::section> *)&dyn_no,tag,&value,
                     (Elf_Xword *)(str.field_2._M_local_buf + 8),(string *)local_c0);
          no = tag;
          tag_00 = value;
          value_00 = str.field_2._8_8_;
          bVar2 = elfio::get_class(reader);
          dynamic_tag(out,no,tag_00,value_00,(string *)local_c0,(uint)bVar2);
          bVar1 = value == 0;
          std::__cxx11::string::~string((string *)local_c0);
          if (bVar1) break;
        }
        std::ostream::operator<<(out,std::endl<char,std::char_traits<char>>);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_*,_std::vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

static void dynamic_tags( std::ostream& out, const elfio& reader )
    {
        for ( const auto& sec : reader.sections ) { // For all sections
            if ( SHT_DYNAMIC == sec->get_type() ) {
                dynamic_section_accessor dynamic( reader, sec.get() );

                Elf_Xword dyn_no = dynamic.get_entries_num();
                if ( dyn_no == 0 )
                    continue;

                out << "Dynamic section (" << sec->get_name() << ")"
                    << std::endl;
                out << "[  Nr ] Tag              Name/Value" << std::endl;
                for ( Elf_Xword i = 0; i < dyn_no; ++i ) {
                    Elf_Xword   tag   = 0;
                    Elf_Xword   value = 0;
                    std::string str;
                    dynamic.get_entry( i, tag, value, str );
                    dynamic_tag( out, i, tag, value, str, reader.get_class() );
                    if ( DT_NULL == tag ) {
                        break;
                    }
                }

                out << std::endl;
            }
        }
    }